

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.h
# Opt level: O1

void __thiscall
spvtools::opt::SSAPropagator::SSAPropagator
          (SSAPropagator *this,IRContext *context,VisitFunction *visit_fn)

{
  _Rb_tree_header *p_Var1;
  _Manager_type p_Var2;
  
  this->ctx_ = context;
  *(undefined8 *)&(this->visit_fn_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->visit_fn_).super__Function_base._M_functor + 8) = 0;
  (this->visit_fn_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->visit_fn_)._M_invoker = (_Invoker_type)0x0;
  p_Var2 = (visit_fn->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->visit_fn_,(_Any_data *)visit_fn,__clone_functor);
    (this->visit_fn_)._M_invoker = visit_fn->_M_invoker;
    (this->visit_fn_).super__Function_base._M_manager = (visit_fn->super__Function_base)._M_manager;
  }
  (this->ssa_edge_uses_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->ssa_edge_uses_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->ssa_edge_uses_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->ssa_edge_uses_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->ssa_edge_uses_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->ssa_edge_uses_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->ssa_edge_uses_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->ssa_edge_uses_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->ssa_edge_uses_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->ssa_edge_uses_).c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _M_initialize_map((_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     *)&this->ssa_edge_uses_,0);
  (this->blocks_).c.
  super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->blocks_).c.
  super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->blocks_).c.
  super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->blocks_).c.
  super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->blocks_).c.
  super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->blocks_).c.
  super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->blocks_).c.
  super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->blocks_).c.
  super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->blocks_).c.
  super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->blocks_).c.
  super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  _M_initialize_map((_Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     *)&this->blocks_,0);
  (this->simulated_blocks_)._M_h._M_buckets = &(this->simulated_blocks_)._M_h._M_single_bucket;
  (this->simulated_blocks_)._M_h._M_bucket_count = 1;
  (this->simulated_blocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->simulated_blocks_)._M_h._M_element_count = 0;
  (this->simulated_blocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->simulated_blocks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->simulated_blocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->do_not_simulate_)._M_h._M_buckets = &(this->do_not_simulate_)._M_h._M_single_bucket;
  (this->do_not_simulate_)._M_h._M_bucket_count = 1;
  (this->do_not_simulate_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->do_not_simulate_)._M_h._M_element_count = 0;
  (this->do_not_simulate_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->do_not_simulate_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->do_not_simulate_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bb_preds_)._M_h._M_buckets = &(this->bb_preds_)._M_h._M_single_bucket;
  (this->bb_preds_)._M_h._M_bucket_count = 1;
  (this->bb_preds_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bb_preds_)._M_h._M_element_count = 0;
  (this->bb_preds_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bb_preds_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bb_preds_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bb_succs_)._M_h._M_buckets = &(this->bb_succs_)._M_h._M_single_bucket;
  (this->bb_succs_)._M_h._M_bucket_count = 1;
  (this->bb_succs_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bb_succs_)._M_h._M_element_count = 0;
  (this->bb_succs_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bb_succs_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bb_succs_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->executable_edges_)._M_t._M_impl.super__Rb_tree_header;
  (this->executable_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->executable_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->executable_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->executable_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->executable_edges_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->statuses_)._M_h._M_buckets = &(this->statuses_)._M_h._M_single_bucket;
  (this->statuses_)._M_h._M_bucket_count = 1;
  (this->statuses_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->statuses_)._M_h._M_element_count = 0;
  (this->statuses_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->statuses_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->statuses_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

SSAPropagator(IRContext* context, const VisitFunction& visit_fn)
      : ctx_(context), visit_fn_(visit_fn) {}